

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.c
# Opt level: O0

char * ExpandScope(Scope *scope,int tab)

{
  bool bVar1;
  char *pcVar2;
  char *results;
  int i;
  _Bool first;
  char *json;
  int tab_local;
  Scope *scope_local;
  
  _i = "[";
  bVar1 = true;
  for (results._0_4_ = 0; (int)results < scope->nodeLength; results._0_4_ = (int)results + 1) {
    if (((scope->nodes[(int)results].isStmt & 1U) != 0) &&
       (scope->nodes[(int)results].scopeId == *scope->scopes)) {
      printf("\n");
      pcVar2 = ExpandASTNode(scope,scope->nodes + (int)results,tab);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        _i = Concat(_i,",");
      }
      _i = Concat(_i,pcVar2);
    }
  }
  pcVar2 = Concat(_i,"]");
  return pcVar2;
}

Assistant:

char* ExpandScope(Scope* scope, int tab){
	char* json = "[";
	bool first = true;
	for (int i = 0; i < scope->nodeLength; i++){
		if (scope->nodes[i].isStmt && scope->nodes[i].scopeId == scope->scopes[0]){
			printf("\n");
			char* results = ExpandASTNode(scope, &scope->nodes[i], tab);
			if (first) first = false;
			else json = Concat(json, ",");
			json = Concat(json, results);
		}
	}
	return Concat(json, "]");
}